

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pytypes.h
# Opt level: O0

void __thiscall pybind11::handle::throw_gilstate_error(handle *this,string *function_name)

{
  FILE *pFVar1;
  undefined8 uVar2;
  runtime_error *this_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  string *local_18;
  string *function_name_local;
  handle *this_local;
  
  pFVar1 = _stderr;
  local_18 = function_name;
  function_name_local = (string *)this;
  uVar2 = std::__cxx11::string::c_str();
  fprintf(pFVar1,
          "%s is being called while the GIL is either not held or invalid. Please see https://pybind11.readthedocs.io/en/stable/advanced/misc.html#common-sources-of-global-interpreter-lock-errors for debugging advice.\nIf you are convinced there is no bug in your code, you can #define PYBIND11_NO_ASSERT_GIL_HELD_INCREF_DECREF to disable this check. In that case you have to ensure this #define is consistently used for all translation units linked into a given pybind11 extension, otherwise there will be ODR violations."
          ,uVar2);
  pFVar1 = _stderr;
  if (this->m_ptr->ob_type->tp_name != (char *)0x0) {
    uVar2 = std::__cxx11::string::c_str();
    fprintf(pFVar1," The failing %s call was triggered on a %s object.",uVar2,
            this->m_ptr->ob_type->tp_name);
  }
  fprintf(_stderr,"\n");
  fflush(_stderr);
  this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::operator+(&local_38,local_18," PyGILState_Check() failure.");
  std::runtime_error::runtime_error(this_00,(string *)&local_38);
  __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void throw_gilstate_error(const std::string &function_name) const {
        fprintf(
            stderr,
            "%s is being called while the GIL is either not held or invalid. Please see "
            "https://pybind11.readthedocs.io/en/stable/advanced/"
            "misc.html#common-sources-of-global-interpreter-lock-errors for debugging advice.\n"
            "If you are convinced there is no bug in your code, you can #define "
            "PYBIND11_NO_ASSERT_GIL_HELD_INCREF_DECREF "
            "to disable this check. In that case you have to ensure this #define is consistently "
            "used for all translation units linked into a given pybind11 extension, otherwise "
            "there will be ODR violations.",
            function_name.c_str());
        if (Py_TYPE(m_ptr)->tp_name != nullptr) {
            fprintf(stderr,
                    " The failing %s call was triggered on a %s object.",
                    function_name.c_str(),
                    Py_TYPE(m_ptr)->tp_name);
        }
        fprintf(stderr, "\n");
        fflush(stderr);
        throw std::runtime_error(function_name + " PyGILState_Check() failure.");
    }